

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::~MessageGenerator(MessageGenerator *this)

{
  MessageLayoutHelper *pMVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  pointer piVar4;
  pointer ppFVar5;
  pointer pcVar6;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->variables_)._M_t);
  pMVar1 = (this->message_layout_helper_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
           _M_head_impl;
  if (pMVar1 != (MessageLayoutHelper *)0x0) {
    (*pMVar1->_vptr_MessageLayoutHelper[1])();
  }
  (this->message_layout_helper_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>._M_head_impl
       = (MessageLayoutHelper *)0x0;
  ppEVar2 = (this->extension_generators_).
            super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar2 != (pointer)0x0) {
    operator_delete(ppEVar2);
  }
  ppEVar3 = (this->enum_generators_).
            super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppEVar3 != (pointer)0x0) {
    operator_delete(ppEVar3);
  }
  piVar4 = (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4);
  }
  ppFVar5 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppFVar5 != (pointer)0x0) {
    operator_delete(ppFVar5);
  }
  FieldGeneratorMap::~FieldGeneratorMap(&this->field_generators_);
  pcVar6 = (this->options_).annotation_guard_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->options_).annotation_guard_name.field_2) {
    operator_delete(pcVar6);
  }
  pcVar6 = (this->options_).annotation_pragma_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->options_).annotation_pragma_name.field_2) {
    operator_delete(pcVar6);
  }
  pcVar6 = (this->options_).runtime_include_base._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->options_).runtime_include_base.field_2) {
    operator_delete(pcVar6);
  }
  pcVar6 = (this->options_).dllexport_decl._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->options_).dllexport_decl.field_2) {
    operator_delete(pcVar6);
  }
  pcVar6 = (this->classname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &(this->classname_).field_2) {
    operator_delete(pcVar6);
    return;
  }
  return;
}

Assistant:

MessageGenerator::~MessageGenerator() = default;